

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QList<QPersistentModelIndex>,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QList<QPersistentModelIndex> *in_RDX;
  QDebug *in_RSI;
  long in_FS_OFFSET;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(&local_18,in_RSI);
  ::operator<<(in_RSI,in_RDX);
  QDebug::~QDebug(&local_10);
  QDebug::~QDebug(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }